

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.h
# Opt level: O3

void __thiscall Scs::Server::ClientConnection::ClientConnection(ClientConnection *this,Server *svr)

{
  this->server = svr;
  (this->thread)._M_id._M_thread = 0;
  (this->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->socket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->clientID = -1;
  this->connected = false;
  (this->sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->sendQueue).m_queue.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
                       *)&this->sendQueue,0);
  *(_Elt_pointer *)
   ((long)&(this->receiveQueue).m_queue.c.
           super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->receiveQueue).m_queue.c.
           super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 0x18) = (_Map_pointer)0x0;
  (this->receiveQueue).m_queue.c.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->receiveQueue).m_queue.c.
           super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish + 8) = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->receiveQueue).m_queue.c.
           super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x10) = (_Elt_pointer)0x0;
  *(_Map_pointer *)
   ((long)&(this->receiveQueue).m_queue.c.
           super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 0x18) = (_Map_pointer)0x0;
  (this->receiveQueue).m_queue.c.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  *(_Elt_pointer *)
   ((long)&(this->receiveQueue).m_queue.c.
           super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start + 8) = (_Elt_pointer)0x0;
  (this->receiveQueue).m_queue.c.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->receiveQueue).m_queue.c.
  super__Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->sendQueue).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->sendQueue).m_bytesSent = 0;
  *(undefined8 *)((long)&(this->sendQueue).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->sendQueue).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->sendQueue).m_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->sendQueue).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  std::
  _Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
                       *)&this->receiveQueue,0);
  (this->receiveQueue).m_receiveBuffer.
  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->receiveQueue).m_receiveBuffer.
  super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->receiveQueue).m_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->receiveQueue).m_messageSize = 0;
  *(undefined8 *)((long)&(this->receiveQueue).m_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->receiveQueue).m_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->receiveQueue).m_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->receiveQueue).m_mutex.super___mutex_base._M_mutex + 8) = 0;
  return;
}

Assistant:

ClientConnection(const Server & svr) :
				server(svr),
				clientID(-1),
				connected(false)
				{}